

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxDantzigPR<double>::selectEnterDenseCoDim
          (SPxDantzigPR<double> *this,double *best,SPxId *enterId)

{
  int i_00;
  double *pdVar1;
  DataKey DVar2;
  DataKey *in_RDX;
  double *in_RSI;
  VectorBase<double> *in_RDI;
  int i;
  double x;
  int in_stack_ffffffffffffffbc;
  SPxSolverBase<double> *this_00;
  
  i_00 = SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2b0556);
  while (i_00 = i_00 + -1, -1 < i_00) {
    SPxSolverBase<double>::test
              ((SPxSolverBase<double> *)
               (in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    pdVar1 = VectorBase<double>::operator[](in_RDI,in_stack_ffffffffffffffbc);
    this_00 = (SPxSolverBase<double> *)*pdVar1;
    if (((double)this_00 <
         -(double)in_RDI[1].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start) && ((double)this_00 < *in_RSI)) {
      DVar2 = (DataKey)SPxSolverBase<double>::id(this_00,i_00);
      *in_RDX = DVar2;
      *in_RSI = (double)this_00;
    }
  }
  return (SPxId)*in_RDX;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterDenseCoDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   R x;

   for(int i = this->thesolver->coDim() - 1; i >= 0; --i)
   {
      x = this->thesolver->test()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId   = this->thesolver->id(i);
            best = x;
         }
      }
   }

   return enterId;
}